

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O1

bool __thiscall QCommandLineParser::isSet(QCommandLineParser *this,QString *name)

{
  long lVar1;
  QString *pQVar2;
  bool bVar3;
  CaseSensitivity in_R8D;
  long lVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QStringView str;
  QStringView str_00;
  QStringView str_01;
  QArrayDataPointer<QString> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  str.m_size = 1;
  str.m_data = (storage_type_conflict *)(name->d).size;
  bVar3 = QtPrivate::QStringList_contains
                    ((QtPrivate *)&this->d->optionNames,(QStringList *)(name->d).ptr,str,in_R8D);
  bVar5 = true;
  if (!bVar3) {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QCommandLineParserPrivate::aliases((QStringList *)&local_48,this->d,name);
    lVar1 = (this->d->optionNames).d.size;
    bVar5 = lVar1 != 0;
    if (bVar5) {
      pQVar2 = (this->d->optionNames).d.ptr;
      str_00.m_size = 1;
      str_00.m_data = (storage_type_conflict *)(pQVar2->d).size;
      bVar3 = QtPrivate::QStringList_contains
                        ((QtPrivate *)&local_48,(QStringList *)(pQVar2->d).ptr,str_00,in_R8D);
      if (!bVar3) {
        lVar4 = 0;
        do {
          bVar3 = lVar1 * 0x18 + -0x18 == lVar4;
          bVar5 = !bVar3;
          if (bVar3) break;
          str_01.m_size = 1;
          str_01.m_data = *(storage_type_conflict **)((long)&pQVar2[1].d.size + lVar4);
          bVar3 = QtPrivate::QStringList_contains
                            ((QtPrivate *)&local_48,
                             *(QStringList **)((long)&pQVar2[1].d.ptr + lVar4),str_01,in_R8D);
          lVar4 = lVar4 + 0x18;
        } while (!bVar3);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QCommandLineParser::isSet(const QString &name) const
{
    d->checkParsed("isSet");
    if (d->optionNames.contains(name))
        return true;
    const QStringList aliases = d->aliases(name);
    for (const QString &optionName : std::as_const(d->optionNames)) {
        if (aliases.contains(optionName))
            return true;
    }
    return false;
}